

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint32_t sve_zcr_len_for_el_arm(CPUARMState *env,int el)

{
  uint uVar1;
  unsigned_long uVar2;
  uint uVar3;
  
  uVar3 = env[1].btype - 1;
  uVar1 = uVar3;
  if ((el < 2) && (uVar1 = (uint)(env->vfp).zcr_el[1] & 0xf, uVar3 < uVar1)) {
    uVar1 = uVar3;
  }
  uVar3 = uVar1;
  if (((el < 3) && ((env->features & 0x100000000) != 0)) &&
     (uVar3 = (uint)(env->vfp).zcr_el[2] & 0xf, uVar1 < uVar3)) {
    uVar3 = uVar1;
  }
  uVar1 = uVar3;
  if (((env->features & 0x200000000) != 0) &&
     (uVar1 = (uint)(env->vfp).zcr_el[3] & 0xf, uVar3 < uVar1)) {
    uVar1 = uVar3;
  }
  uVar1 = uVar1 & 0xf;
  uVar3 = uVar1;
  if (((uint)env[1].daif >> uVar1 & 1) == 0) {
    uVar2 = find_last_bit(&env[1].daif,(ulong)uVar1);
    uVar3 = (uint)uVar2;
    if (uVar1 <= uVar3) {
      __assert_fail("end_len < start_len",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                    ,0x1636,"uint32_t sve_zcr_get_valid_len(ARMCPU *, uint32_t)");
    }
  }
  return uVar3;
}

Assistant:

uint32_t sve_zcr_len_for_el(CPUARMState *env, int el)
{
    ARMCPU *cpu = env_archcpu(env);
    uint32_t zcr_len = cpu->sve_max_vq - 1;

    if (el <= 1) {
        zcr_len = MIN(zcr_len, 0xf & (uint32_t)env->vfp.zcr_el[1]);
    }
    if (el <= 2 && arm_feature(env, ARM_FEATURE_EL2)) {
        zcr_len = MIN(zcr_len, 0xf & (uint32_t)env->vfp.zcr_el[2]);
    }
    if (arm_feature(env, ARM_FEATURE_EL3)) {
        zcr_len = MIN(zcr_len, 0xf & (uint32_t)env->vfp.zcr_el[3]);
    }

    return sve_zcr_get_valid_len(cpu, zcr_len);
}